

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O0

void intogroups(bucket_conflict *b,int *used1,int *used2,int pos)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  list_conflict plVar4;
  uint local_44;
  bucket_conflict pbStack_40;
  boolean finis;
  bucket s;
  int local_30;
  character high;
  character ch2;
  character ch1;
  character ch;
  int pos_local;
  int *used2_local;
  int *used1_local;
  bucket_conflict *b_local;
  
  for (high = 0; high < used1[0x100]; high = high + 1) {
    iVar1 = used1[high];
    for (local_30 = 0; local_30 < used2[0x100]; local_30 = local_30 + 1) {
      uVar2 = used2[local_30];
      uVar3 = iVar1 << 8 | uVar2;
      if (b[(int)uVar3] != (bucket_conflict)0x0) {
        for (pbStack_40 = b[(int)uVar3]; pbStack_40 != (bucket_conflict)0x0;
            pbStack_40 = pbStack_40->next) {
          local_44 = (uint)((uVar2 & 0xff) == 0);
          if ((pbStack_40->size < 0x14) && (local_44 == 0)) {
            if (1 < pbStack_40->size) {
              plVar4 = ForListInsertsort(pbStack_40->head,&pbStack_40->tail,pos);
              pbStack_40->head = plVar4;
            }
            local_44 = 1;
          }
          intogroup(pbStack_40->tag,pbStack_40->head,pbStack_40->tail,local_44);
        }
        b[(int)uVar3] = (bucket_conflict)0x0;
      }
    }
  }
  return;
}

Assistant:

static void intogroups(bucket b[], int *used1, int *used2, int pos)
{
   character ch, ch1, ch2, high;
   bucket s;
   boolean finis;

   for (ch1 = 0; ch1 < used1[CHARS]; ch1++) {
      high = used1[ch1] << 8;
      for (ch2 = 0; ch2 < used2[CHARS]; ch2++) {
         ch = high | used2[ch2];
         if (!b[ch]) continue;
         for (s = b[ch]; s; s = s->next) {
            finis = IS_ENDMARK(ch);
            if (s->size < INSERTBREAK && !finis) {
               if (s->size > 1)
                  s->head = ForListInsertsort(s->head, &s->tail, pos);
               finis = TRUE;
            }
            intogroup(s->tag, s->head, s->tail, finis);
         }
         b[ch] = NULL;
      }
   }
}